

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O3

void __thiscall QRingBuffer::free(QRingBuffer *this,void *__ptr)

{
  QRingChunk *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  iterator iVar5;
  void *pvVar6;
  
  if (0 < (long)__ptr) {
    do {
      if ((this->buffers).d.size == 1) {
LAB_003855f8:
        iVar5 = QList<QRingChunk>::begin(&this->buffers);
        lVar4 = this->bufferSize - (long)__ptr;
        if (lVar4 != 0) {
          (iVar5.i)->headOffset = (iVar5.i)->headOffset + (long)__ptr;
          this->bufferSize = lVar4;
          return;
        }
        if (((((iVar5.i)->chunk).d.size <= (long)this->basicBlockSize) &&
            (pDVar3 = ((iVar5.i)->chunk).d.d, pDVar3 != (Data *)0x0)) &&
           ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>
            == 1)) {
          (iVar5.i)->headOffset = 0;
          (iVar5.i)->tailOffset = 0;
          this->bufferSize = 0;
          return;
        }
        clear(this);
        return;
      }
      pQVar1 = (this->buffers).d.ptr;
      lVar4 = pQVar1->tailOffset - pQVar1->headOffset;
      pvVar6 = (void *)((long)__ptr - lVar4);
      if ((long)__ptr < lVar4) goto LAB_003855f8;
      this->bufferSize = this->bufferSize - lVar4;
      pDVar2 = (this->buffers).d.d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
         )) {
        QArrayDataPointer<QRingChunk>::reallocateAndGrow
                  ((QArrayDataPointer<QRingChunk> *)this,GrowsAtEnd,0,
                   (QArrayDataPointer<QRingChunk> *)0x0);
      }
      QtPrivate::QGenericArrayOps<QRingChunk>::eraseFirst((QGenericArrayOps<QRingChunk> *)this);
      __ptr = pvVar6;
    } while (0 < (long)pvVar6);
  }
  return;
}

Assistant:

void QRingBuffer::free(qint64 bytes)
{
    Q_ASSERT(bytes <= bufferSize);

    while (bytes > 0) {
        const qint64 chunkSize = buffers.constFirst().size();

        if (buffers.size() == 1 || chunkSize > bytes) {
            QRingChunk &chunk = buffers.first();
            // keep a single block around if it does not exceed
            // the basic block size, to avoid repeated allocations
            // between uses of the buffer
            if (bufferSize == bytes) {
                if (chunk.capacity() <= basicBlockSize && !chunk.isShared()) {
                    chunk.reset();
                    bufferSize = 0;
                } else {
                    clear(); // try to minify/squeeze us
                }
            } else {
                Q_ASSERT(bytes < QByteArray::maxSize());
                chunk.advance(bytes);
                bufferSize -= bytes;
            }
            return;
        }

        bufferSize -= chunkSize;
        bytes -= chunkSize;
        buffers.removeFirst();
    }
}